

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O0

float __thiscall Randomizer::randXAxis(Randomizer *this)

{
  result_type_conflict rVar1;
  Randomizer *this_local;
  
  rVar1 = std::uniform_real_distribution<float>::operator()(this->XAxisRnd,this->RndCore);
  return rVar1;
}

Assistant:

float Randomizer::randXAxis()
{
    return (*XAxisRnd)(*RndCore);
}